

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centroid_test.cpp
# Opt level: O2

void __thiscall DECOMPOSE_Benchmark5times1e4_Test::TestBody(DECOMPOSE_Benchmark5times1e4_Test *this)

{
  pointer *this_00;
  pointer *__return_storage_ptr__;
  char *message;
  int mode;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b0;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> calcdegs;
  Graph G;
  vector<int,_std::allocator<int>_> degs;
  AssertHelper local_48;
  internal local_40 [8];
  AssertionResult gtest_ar;
  
  this_00 = &degs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  for (mode = 0; mode != 5; mode = mode + 1) {
    __return_storage_ptr__ =
         &calcdegs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
    gen_tree((Graph *)__return_storage_ptr__,10000,mode);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_b0,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)__return_storage_ptr__);
    deg((vector<int,_std::allocator<int>_> *)
        &G.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b0);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_b0);
    example_decompose((vector<int,_std::allocator<int>_> *)local_98,
                      (Graph *)&calcdegs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
    testing::internal::
    CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              (local_40,"degs","calcdegs",
               (vector<int,_std::allocator<int>_> *)
               &G.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<int,_std::allocator<int>_> *)local_98);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      message = "";
      if (gtest_ar._0_8_ != 0) {
        message = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/centroid_test.cpp"
                 ,0x98,message);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_98);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               &G.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&calcdegs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

TEST(DECOMPOSE, Benchmark5times1e4) {
	int runs = 5, size = 10000;
	rep(i, 0, runs) {
		Graph G = gen_tree(size, i);
		vector<int> degs = deg(G);
		vector<int> calcdegs = example_decompose(G);
		EXPECT_EQ(degs, calcdegs);
	}
}